

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O2

void __thiscall Commander::printHelp(Commander *this)

{
  long *plVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  string local_50 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Available commands: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var3 = (this->cmds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->cmds)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    plVar1 = *(long **)(p_Var3 + 2);
    if (plVar1 != (long *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)(p_Var3 + 1));
      poVar2 = std::operator<<(poVar2," \t- ");
      (**(code **)(*plVar1 + 0x10))(local_50,plVar1);
      poVar2 = std::operator<<(poVar2,local_50);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_50);
    }
  }
  return;
}

Assistant:

void Commander::printHelp()
{
    std::cout << "Available commands: " << cmds.size() << endl;
    std::map<std::string, Command*>::iterator itr;
    for (itr = cmds.begin(); itr != cmds.end(); ++itr) {
        Command *cmd = itr->second;
        if (cmd == NULL) continue;
        std::cout << itr->first << " \t- " << cmd->getDescription() << endl;
    }
}